

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bbr2_sender.cc
# Opt level: O2

bool __thiscall quic::Bbr2Sender::IsPipeSufficientlyFull(Bbr2Sender *this)

{
  ulong uVar1;
  QuicByteCount QVar2;
  uint uVar3;
  float fVar4;
  
  uVar1 = this->unacked_packets_->_bytes_in_flight;
  if (this->mode_ == STARTUP) {
    fVar4 = 1.5;
  }
  else {
    fVar4 = (this->model_).pacing_gain_;
    uVar3 = -(uint)(1.0 < fVar4);
    fVar4 = (float)(~uVar3 & 0x3f8ccccd | (uint)fVar4 & uVar3);
  }
  QVar2 = GetTargetCongestionWindow(this,fVar4);
  return QVar2 <= uVar1;
}

Assistant:

bool Bbr2Sender::IsPipeSufficientlyFull() const {
	QuicByteCount bytes_in_flight = unacked_packets_->bytes_in_flight();
  // See if we need more bytes in flight to see more bandwidth.
  if (mode_ == Bbr2Mode::STARTUP) {
    // STARTUP exits if it doesn't observe a 25% bandwidth increase, so the CWND
    // must be more than 25% above the target.
    return bytes_in_flight >= GetTargetCongestionWindow(1.5);
  }
  if (model_.pacing_gain() > 1) {
    // Super-unity PROBE_BW doesn't exit until 1.25 * BDP is achieved.
    return bytes_in_flight >= GetTargetCongestionWindow(model_.pacing_gain());
  }
  // If bytes_in_flight are above the target congestion window, it should be
  // possible to observe the same or more bandwidth if it's available.
  return bytes_in_flight >= GetTargetCongestionWindow(1.1);
}